

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

void throw_net_err(char *msg,int sock_err)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  vm_obj_id_t vVar4;
  size_t len;
  uint argc;
  vm_obj_id_t cls;
  
  vVar4 = G_predef_X.net_reset_exception;
  vVar3 = G_predef_X.net_exception;
  pvVar2 = sp_;
  if (sock_err == 0) {
    argc = 1;
  }
  else {
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_INT;
    (pvVar2->val).intval = sock_err;
    argc = 2;
  }
  cls = 0;
  if (sock_err - 0x67U < 2) {
    cls = vVar4;
  }
  if (cls == 0) {
    cls = vVar3;
  }
  len = strlen(msg);
  CVmRun::push_string(&G_interpreter_X,msg,len);
  CVmRun::throw_new_class(&G_interpreter_X,cls,argc,msg);
}

Assistant:

static void throw_net_err(VMG_ const char *msg, int sock_err)
{
    /* 
     *   Determine the exception class, based on the error code:
     *   
     *.  - ECONNRESET -> SocketDisconnectException
     *.  - everything else -> the base NetException
     */
    vm_obj_id_t cl = VM_INVALID_OBJ;
    switch (sock_err)
    {
    case OS_ECONNRESET:
    case OS_ECONNABORTED:
        cl = G_predef->net_reset_exception;
        break;
    }

    /* 
     *   if we didn't pick a special class for the error, or the class we
     *   selected wasn't imported, use the base NetException class by default
     */
    if (cl == VM_INVALID_OBJ)
        cl = G_predef->net_exception;

    /* throw new exceptionClass(msg, errno) */
    int argc = 1;
    if (sock_err != 0)
    {
        G_stk->push_int(vmg_ sock_err);
        ++argc;
    }
    G_interpreter->push_string(vmg_ msg);
    G_interpreter->throw_new_class(vmg_ cl, argc, msg);
}